

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_library_path.c
# Opt level: O3

int portability_library_path(char *name,char *path,size_t *length)

{
  int iVar1;
  int iVar2;
  phdr_callback_type data;
  char *local_20;
  char *local_18;
  size_t local_10;
  
  local_10 = 0;
  local_20 = name;
  local_18 = path;
  iVar1 = dl_iterate_phdr(portability_library_path_phdr_callback,&local_20);
  iVar2 = 1;
  if (iVar1 == 1) {
    iVar2 = 0;
    if (length != (size_t *)0x0) {
      *length = local_10;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int portability_library_path(const char name[], portability_library_path_str path, size_t *length)
{
#if defined(unix) || defined(__unix__) || defined(__unix) || \
	defined(linux) || defined(__linux__) || defined(__linux) || defined(__gnu_linux)

	struct phdr_callback_type data = {
		name,
		path,
		0
	};

	if (dl_iterate_phdr(&portability_library_path_phdr_callback, (void *)&data) != 1)
	{
		return 1;
	}

	if (length != NULL)
	{
		*length = data.length;
	}

	return 0;

#elif defined(WIN32) || defined(_WIN32) || \
	defined(__CYGWIN__) || defined(__CYGWIN32__) || \
	defined(__MINGW32__) || defined(__MINGW64__)

	HMODULE handle_modules[1024];
	HANDLE handle_process = GetCurrentProcess();
	DWORD cb_needed;

	if (EnumProcessModules(handle_process, handle_modules, sizeof(handle_modules), &cb_needed))
	{
		size_t iterator;

		for (iterator = 0; iterator < (cb_needed / sizeof(HMODULE)); ++iterator)
		{
			if (GetModuleFileNameEx(handle_process, handle_modules[iterator], path, PORTABILITY_LIBRARY_PATH_SIZE))
			{
				if (portability_library_path_ends_with(path, name) == 0)
				{
					if (length != NULL)
					{
						*length = strnlen(path, PORTABILITY_LIBRARY_PATH_SIZE);
					}

					return 0;
				}
			}
		}
	}

	return 1;

#elif (defined(__APPLE__) && defined(__MACH__)) || defined(__MACOSX__)

	static const char dylib_suffix[] = "dylib";
	uint32_t image_index, size = _dyld_image_count();
	size_t name_length = strnlen(name, PORTABILITY_LIBRARY_PATH_SIZE);
	size_t name_dylib_length = name_length + 3;

	if (portability_library_path_ends_with(name, "so") == 0 && name_dylib_length < PORTABILITY_LIBRARY_PATH_SIZE)
	{
		memcpy(path, name, sizeof(char) * (name_length - 2));
		memcpy(path, dylib_suffix, sizeof(dylib_suffix));
	}

	for (image_index = 0; image_index < size; ++image_index)
	{
		const char *image_name = _dyld_get_image_name(image_index);

		if (portability_library_path_ends_with(image_name, path) == 0)
		{
			size_t image_length = strnlen(image_name, PORTABILITY_LIBRARY_PATH_SIZE);

			if (image_length >= PORTABILITY_LIBRARY_PATH_SIZE)
			{
				return 1;
			}

			memcpy(path, image_name, sizeof(char) * (image_length + 1));

			if (length != NULL)
			{
				*length = image_length;
			}

			return 0;
		}
	}

	return 1;

#else
	/* Not supported */
	return 1;
#endif
}